

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareRootExpression.cpp
# Opt level: O0

BaseExpressionPtr __thiscall
Kandinsky::SquareRootExpression::derivative
          (SquareRootExpression *this,VariableExpressionPtr *variable)

{
  element_type *peVar1;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SquareRootExpression *in_RSI;
  Expression *in_RDI;
  BaseExpressionPtr BVar2;
  shared_ptr<Kandinsky::BaseExpression> *in_stack_00000050;
  Expression *in_stack_00000058;
  Expression *arg;
  undefined1 local_88 [16];
  shared_ptr<Kandinsky::BaseExpression> *in_stack_ffffffffffffff88;
  Expression *arg1;
  
  arg = in_RDI;
  arg1 = in_RDI;
  sqrt<std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>(in_stack_ffffffffffffff88);
  operator/<double,_Kandinsky::SquareRootExpression,_nullptr>((double *)arg1,in_RSI);
  peVar1 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x12df6e);
  (*peVar1->_vptr_BaseExpression[1])(local_88,peVar1,in_RDX);
  operator*<Kandinsky::Expression,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (in_stack_00000058,in_stack_00000050);
  BaseExpression::makePtr<Kandinsky::Expression>(arg);
  Expression::~Expression((Expression *)0x12dfb9);
  std::shared_ptr<Kandinsky::BaseExpression>::~shared_ptr
            ((shared_ptr<Kandinsky::BaseExpression> *)0x12dfc3);
  Expression::~Expression((Expression *)0x12dfcd);
  ~SquareRootExpression((SquareRootExpression *)0x12dfd7);
  BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (BaseExpressionPtr)
         BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr SquareRootExpression::derivative(const VariableExpressionPtr& variable) const
    {
        return makePtr(0.5 / sqrt(m_arg) * m_arg->derivative(variable));
    }